

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
insert<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,capnp::StructSchema::Field&>
          (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                 table,size_t pos,Field *params)

{
  size_t *psVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  CapTableReader *pCVar7;
  HashBucket *pHVar8;
  Entry *this_00;
  ulong targetSize;
  Field *in_R9;
  long lVar9;
  HashBucket *pHVar10;
  Maybe<unsigned_long> MVar11;
  
  this_00 = table.ptr;
  uVar4 = (long)(this_00->key).proto._reader.capTable * 2;
  if (uVar4 < (*(size_t *)&(this_00->key).index + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar4) {
      targetSize = uVar4;
    }
    HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>::
    rehash((HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>
            *)this_00,targetSize);
  }
  uVar5 = capnp::StructSchema::Field::hashCode(in_R9);
  uVar6 = kj::_::chooseBucket((uint)(uVar5 != 0),*(uint *)&(this_00->key).proto._reader.capTable);
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          (this_00->key).proto._reader.segment;
  pHVar8 = (HashBucket *)0x0;
  do {
    pHVar10 = (HashBucket *)(aVar3.value + (ulong)uVar6 * 8);
    uVar2 = pHVar10->value;
    if (uVar2 == 1) {
      if (pHVar8 == (HashBucket *)0x0) {
        pHVar8 = pHVar10;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar8 != (HashBucket *)0x0) {
          psVar1 = (size_t *)&(this_00->key).index;
          *psVar1 = *psVar1 - 1;
          pHVar10 = pHVar8;
        }
        *pHVar10 = (HashBucket)(((ulong)(uVar5 != 0) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                 )0x0;
        goto LAB_0022e356;
      }
      if (pHVar10->hash == (uint)(uVar5 != 0)) {
        lVar9 = (ulong)(uVar2 - 2) * 0x48;
        if ((*(RawBrandedSchema **)(table.size_ + lVar9) == (in_R9->parent).super_Schema.raw) &&
           (*(uint *)(table.size_ + 8 + lVar9) == in_R9->index)) {
          *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_0022e356:
          MVar11.ptr.field_1.value = aVar3.value;
          MVar11.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar11.ptr;
        }
      }
    }
    pCVar7 = (CapTableReader *)((ulong)uVar6 + 1);
    uVar6 = (uint)pCVar7;
    if (pCVar7 == (this_00->key).proto._reader.capTable) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }